

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_info.cpp
# Opt level: O0

ktx_error_code_e __thiscall
ktx::CommandInfo::printInfoJSON(CommandInfo *this,istream *file,bool minified)

{
  format_args args;
  string_view fmt;
  string_view filepath;
  byte bVar1;
  int iVar2;
  int iVar3;
  _Ios_Openmode seek_mode;
  streamoff sVar4;
  char **args_1;
  basic_streambuf<char,_std::char_traits<char>_> *streambuf;
  ktxStream *pkVar5;
  byte in_DL;
  char *extraout_RDX;
  long *in_RSI;
  long in_RDI;
  undefined1 auVar6 [16];
  ktx_error_code_e result;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  PrintIndent out;
  bool ktxWillPrintOutput;
  ktx_uint8_t identifier [12];
  bool fileIdentifierIsCorrect;
  pos_type fileSize;
  int validationResult;
  bool first;
  PrintIndent pi;
  ostringstream messagesOS;
  char *nl;
  char *space;
  int indent_width;
  int base_indent;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  ktx_error_code_e local_450;
  anon_class_32_4_d1f13690 *in_stack_fffffffffffffbb8;
  undefined4 in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc4;
  undefined8 in_stack_fffffffffffffbc8;
  undefined7 in_stack_fffffffffffffbd0;
  undefined1 in_stack_fffffffffffffbd7;
  char **in_stack_fffffffffffffbf0;
  char **in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 in_stack_fffffffffffffc07;
  undefined1 uVar7;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffc0c;
  int depth;
  PrintIndent *this_00;
  int depth_00;
  undefined4 in_stack_fffffffffffffc20;
  string local_378 [32];
  char *local_358;
  char **local_350;
  undefined1 local_341;
  undefined8 *local_340;
  int local_338;
  int local_334;
  undefined1 local_32e;
  undefined1 local_32d [12];
  byte local_321;
  fpos local_320 [16];
  byte *local_310;
  ostringstream **local_308;
  char **local_300;
  char **local_2f8;
  undefined1 local_2c0 [16];
  string local_2b0 [32];
  int local_290;
  byte local_289;
  ostringstream *local_288;
  int local_280;
  int local_27c;
  ostringstream local_278 [376];
  char *local_100;
  char *local_f8;
  int local_ec;
  int local_e8;
  byte local_e1;
  long *local_e0;
  ktx_error_code_e local_cc;
  undefined8 local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_c0;
  char *local_b8;
  char **local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  string *in_stack_ffffffffffffff70;
  istream *in_stack_ffffffffffffff78;
  char *local_80;
  char **ppcStack_78;
  char *local_70;
  char **local_68;
  char **local_60;
  char *local_58;
  char **ppcStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char **local_10;
  char *local_8;
  
  local_e1 = in_DL & 1;
  local_e8 = 0;
  local_ec = ((byte)~local_e1 & 1) << 2;
  local_f8 = " ";
  if (local_e1 != 0) {
    local_f8 = "";
  }
  local_100 = "\n";
  if (local_e1 != 0) {
    local_100 = "";
  }
  local_e0 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_278);
  local_280 = local_e8;
  local_27c = local_ec;
  local_289 = 1;
  local_288 = local_278;
  local_2c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x50));
  filepath._M_len._7_1_ = in_stack_fffffffffffffc07;
  filepath._M_len._0_7_ = in_stack_fffffffffffffc00;
  filepath._M_str._0_4_ = in_stack_fffffffffffffc08;
  filepath._M_str._4_4_ = in_stack_fffffffffffffc0c;
  fmtInFile_abi_cxx11_(filepath);
  local_310 = &local_289;
  local_308 = &local_288;
  local_300 = &local_100;
  local_2f8 = &local_f8;
  std::function<void(ktx::ValidationReport_const&)>::
  function<ktx::CommandInfo::printInfoJSON(std::istream&,bool)::__0,void>
            ((function<void_(const_ktx::ValidationReport_&)> *)
             CONCAT44(in_stack_fffffffffffffbc4,in_stack_fffffffffffffbc0),in_stack_fffffffffffffbb8
            );
  iVar2 = validateIOStream(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           (bool)in_stack_ffffffffffffff6f,(bool)in_stack_ffffffffffffff6e,
                           in_stack_ffffffffffffff60);
  std::function<void_(const_ktx::ValidationReport_&)>::~function
            ((function<void_(const_ktx::ValidationReport_&)> *)0x29f6cb);
  std::__cxx11::string::~string(local_2b0);
  local_290 = iVar2;
  std::ios::clear((int)local_e0 + (int)*(undefined8 *)(*local_e0 + -0x18));
  std::istream::seekg((long)local_e0,_S_beg);
  auVar6 = std::istream::tellg();
  local_321 = 0;
  local_320 = (fpos  [16])auVar6;
  sVar4 = std::fpos::operator_cast_to_long(local_320);
  this_00 = auVar6._8_8_;
  depth_00 = auVar6._4_4_;
  uVar8 = (undefined4)sVar4;
  depth = (int)((ulong)sVar4 >> 0x20);
  if (0xb < sVar4) {
    std::istream::seekg((long)local_e0,_S_beg);
    std::istream::read((char *)local_e0,(long)local_32d);
    iVar3 = memcmp(local_32d,printInfoJSON::ktx2_identifier_reference,0xc);
    local_321 = iVar3 == 0;
  }
  uVar7 = false;
  if ((local_321 & 1) != 0) {
    in_stack_fffffffffffffbf8 = (char **)std::fpos::operator_cast_to_long(local_320);
    uVar7 = 0x4f < (long)in_stack_fffffffffffffbf8;
  }
  local_340 = &std::cout;
  local_338 = local_e8;
  local_334 = local_ec;
  local_32e = uVar7;
  PrintIndent::operator()
            (this_00,depth,(char (*) [5])CONCAT17(uVar7,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8);
  PrintIndent::operator()
            (this_00,depth,(char (*) [61])CONCAT17(uVar7,in_stack_fffffffffffffc00),
             in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  local_341 = local_290 == 0;
  PrintIndent::operator()
            ((PrintIndent *)CONCAT44(iVar2,in_stack_fffffffffffffc20),depth_00,
             (char (*) [16])this_00,(char **)CONCAT44(depth,uVar8),
             (bool *)CONCAT17(uVar7,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8);
  if ((local_289 & 1) == 0) {
    PrintIndent::operator()
              (this_00,depth,(char (*) [17])CONCAT17(uVar7,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
    local_68 = &local_358;
    local_70 = "{}";
    local_18 = "{}";
    local_358 = "{}";
    local_10 = local_68;
    args_1 = (char **)std::char_traits<char>::length((char_type *)0x29f9cb);
    local_8 = local_70;
    local_350 = args_1;
    std::__cxx11::ostringstream::str();
    local_80 = local_358;
    ppcStack_78 = local_350;
    local_a8 = ::fmt::v10::
               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffbb8);
    local_48 = &local_a8;
    local_60 = &local_80;
    local_b8 = local_80;
    local_b0 = ppcStack_78;
    local_40 = &local_c8;
    local_28 = 0xd;
    local_c8 = 0xd;
    fmt.size_ = (size_t)local_a8;
    fmt.data_ = extraout_RDX;
    args.field_1._0_7_ = in_stack_fffffffffffffbd0;
    args.desc_ = in_stack_fffffffffffffbc8;
    args.field_1._7_1_ = in_stack_fffffffffffffbd7;
    local_58 = local_b8;
    ppcStack_50 = local_b0;
    local_38 = local_48;
    local_30 = local_48;
    local_20 = local_40;
    local_c0 = local_48;
    ::fmt::v10::vprint(fmt,args);
    std::__cxx11::string::~string(local_378);
    PrintIndent::operator()
              (this_00,depth,(char (*) [5])CONCAT17(uVar7,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    PrintIndent::operator()
              (this_00,depth,(char (*) [6])CONCAT17(uVar7,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8,args_1);
  }
  else {
    PrintIndent::operator()
              ((PrintIndent *)CONCAT44(iVar2,in_stack_fffffffffffffc20),depth_00,
               (char (*) [20])this_00,(char **)CONCAT44(depth,uVar8),
               (char **)CONCAT17(uVar7,in_stack_fffffffffffffc00),in_stack_fffffffffffffbf8);
  }
  std::istream::seekg((long)local_e0,_S_beg);
  bVar1 = std::ios::operator!((ios *)((long)local_e0 + *(long *)(*local_e0 + -0x18)));
  if ((bVar1 & 1) == 0) {
    streambuf = (basic_streambuf<char,_std::char_traits<char>_> *)std::ios::rdbuf();
    seek_mode = std::operator|(_S_in,_S_bin);
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
              ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
               CONCAT17(bVar1,in_stack_fffffffffffffbd0),streambuf,seek_mode);
    pkVar5 = StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::stream
                       ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
                        0x29fd3d);
    local_450 = ktxPrintKTX2InfoJSONForStream(pkVar5,local_e8 + 1,local_ec,local_e1 & 1);
    PrintIndent::operator()
              (this_00,depth,(char (*) [5])CONCAT17(uVar7,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    if (local_290 != 0) {
      local_450 = KTX_SUCCESS;
    }
    local_cc = local_450;
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              ((StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> *)
               CONCAT44(seek_mode,in_stack_fffffffffffffbc0));
  }
  else {
    PrintIndent::operator()
              (this_00,depth,(char (*) [5])CONCAT17(uVar7,in_stack_fffffffffffffc00),
               in_stack_fffffffffffffbf8);
    local_cc = KTX_SUCCESS;
    if (local_290 == 0) {
      local_cc = KTX_FILE_SEEK_ERROR;
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_278);
  return local_cc;
}

Assistant:

KTX_error_code CommandInfo::printInfoJSON(std::istream& file, bool minified) {
    const auto base_indent = minified ? 0 : +0;
    const auto indent_width = minified ? 0 : 4;
    const auto space = minified ? "" : " ";
    const auto nl = minified ? "" : "\n";

    std::ostringstream messagesOS;
    PrintIndent pi{messagesOS, base_indent, indent_width};

    bool first = true;
    const auto validationResult = validateIOStream(file, fmtInFile(options.inputFilepath), false, false, [&](const ValidationReport& issue) {
        if (!std::exchange(first, false)) {
            pi(2, "}},{}", nl);
        }
        pi(2, "{{{}", nl);
        pi(3, "\"id\":{}{},{}", space, issue.id, nl);
        pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
        pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
        pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
    });

    file.clear(); // Clear any unexpected EOF from validation

    // Workaround detection to decide if ktx will produce any output into the json
    // to eliminate a trailing comma
    file.seekg(0, std::ios_base::end);
    const auto fileSize = file.tellg();
    bool fileIdentifierIsCorrect = false;
    if (fileSize >= 12) {
        static constexpr uint8_t ktx2_identifier_reference[12] = KTX2_IDENTIFIER_REF;
        ktx_uint8_t identifier[12];
        file.seekg(0, std::ios_base::beg);
        file.read(reinterpret_cast<char*>(identifier), 12);
        fileIdentifierIsCorrect = std::memcmp(identifier, ktx2_identifier_reference, 12) == 0;
    }
    const auto ktxWillPrintOutput = fileIdentifierIsCorrect && fileSize >= KTX2_HEADER_SIZE;

    PrintIndent out{std::cout, base_indent, indent_width};
    out(0, "{{{}", nl);
    out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/info_v0.json\",{}", space, nl);
    out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
    if (!first) {
        out(1, "\"messages\":{}[{}", space, nl);
        fmt::print("{}", std::move(messagesOS).str());
        out(2, "}}{}", nl);
        out(1, "]{}{}", ktxWillPrintOutput ? "," : "", nl);
    } else {
        out(1, "\"messages\":{}[]{}{}", space, ktxWillPrintOutput ? "," : "", nl);
    }

    file.seekg(0, std::ios_base::beg);
    if (!file) {
        out(0, "}}{}", nl);
        return validationResult == 0 ? KTX_FILE_SEEK_ERROR : KTX_SUCCESS;
    }

    StreambufStream<std::streambuf*> ktx2Stream{file.rdbuf(), std::ios::in | std::ios::binary};
    const auto result = ktxPrintKTX2InfoJSONForStream(ktx2Stream.stream(), base_indent + 1, indent_width, minified);
    out(0, "}}{}", nl);

    return validationResult == 0 ? result : KTX_SUCCESS;
}